

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

void __thiscall TypeOpNotEqual::TypeOpNotEqual(TypeOpNotEqual *this,TypeFactory *t)

{
  OpBehavior *pOVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"!=",&local_31);
  TypeOpBinary::TypeOpBinary
            (&this->super_TypeOpBinary,t,CPUI_INT_NOTEQUAL,&local_30,TYPE_BOOL,TYPE_INT);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_TypeOpBinary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003f2980;
  (this->super_TypeOpBinary).super_TypeOp.opflags = 0x14080;
  (this->super_TypeOpBinary).super_TypeOp.addlflags = 1;
  pOVar1 = (OpBehavior *)operator_new(0x10);
  pOVar1->opcode = CPUI_INT_NOTEQUAL;
  pOVar1->isunary = false;
  pOVar1->isspecial = false;
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003fe1a0;
  (this->super_TypeOpBinary).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpNotEqual::TypeOpNotEqual(TypeFactory *t)
  : TypeOpBinary(t,CPUI_INT_NOTEQUAL,"!=",TYPE_BOOL,TYPE_INT)
{
  opflags = PcodeOp::binary | PcodeOp::booloutput | PcodeOp::commutative;
  addlflags = inherits_sign;
  behave = new OpBehaviorNotEqual();
}